

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O0

void __thiscall MxxSort_SampleSort1_Test::TestBody(MxxSort_SampleSort1_Test *this)

{
  int iVar1;
  bool bVar2;
  uint __seed;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  char *pcVar6;
  reference pvVar7;
  char *in_R9;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar;
  bool local_121;
  undefined1 local_120 [7];
  bool sorted;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  int prev;
  AssertHelper local_b8;
  Message local_b0;
  int *local_a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> vec;
  comm c;
  MxxSort_SampleSort1_Test *this_local;
  
  mxx::comm::comm((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,0xe6,&local_49);
  std::allocator<int>::~allocator(&local_49);
  __seed = mxx::comm::rank((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
  srand(__seed);
  iVar4 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_48);
  iVar5 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_48)
  ;
  std::generate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int(*)()>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar4._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar5._M_current,
             rand);
  iVar4 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_48);
  iVar5 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_48)
  ;
  mxx::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (iVar4._M_current,iVar5._M_current,
             &vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_a0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_48);
  local_a8 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_48);
  bVar2 = std::is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (local_a0,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                              local_a8);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_98,bVar2);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&prev,(internal *)local_98,
               (AssertionResult *)"std::is_sorted(vec.begin(), vec.end())","false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
               ,0x27,pcVar6);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&prev);
    testing::Message::~Message(&local_b0);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)local_48);
    gtest_ar__1.message_.ptr_._0_4_ =
         mxx::right_shift<int>
                   (pvVar7,(comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
    iVar3 = mxx::comm::rank((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
    iVar1 = (int)gtest_ar__1.message_.ptr_;
    if (0 < iVar3) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::front
                         ((vector<int,_std::allocator<int>_> *)local_48);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_f0,iVar1 <= *pvVar7);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar2) {
        testing::Message::Message(&local_f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_120,(internal *)local_f0,(AssertionResult *)"prev <= vec.front()"
                   ,"false","true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
                   ,0x2d,pcVar6);
        testing::internal::AssertHelper::operator=(&local_100,&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        std::__cxx11::string::~string((string *)local_120);
        testing::Message::~Message(&local_f8);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      if (gtest_ar__1.message_.ptr_._4_4_ != 0) goto LAB_001f15cf;
    }
    iVar4 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_48);
    iVar5 = std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)local_48);
    local_121 = mxx::
                is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                          (iVar4._M_current,iVar5._M_current,
                           &vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    local_151 = true;
    testing::internal::EqHelper<false>::Compare<bool,bool>
              ((EqHelper<false> *)local_150,"true","sorted",&local_151,&local_121);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
    if (!bVar2) {
      testing::Message::Message(&local_160);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
                 ,0x32,pcVar6);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::Message::~Message(&local_160);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      gtest_ar__1.message_.ptr_._4_4_ = 0;
    }
  }
LAB_001f15cf:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  mxx::comm::~comm((comm *)&vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(MxxSort, SampleSort1) {
    mxx::comm c;
    // simple sorting test with same number of elements for each processor
    std::vector<int> vec(230);
    srand(c.rank());
    std::generate(vec.begin(), vec.end(), std::rand);

    // sort
    mxx::sort(vec.begin(), vec.end(), std::less<int>(), c);

    // should be locally sorted
    ASSERT_TRUE(std::is_sorted(vec.begin(), vec.end()));

    // first element on each proc should be larger or equal to last one on
    // previous processor
    int prev = mxx::right_shift(vec.back(), c);
    if (c.rank() > 0) {
        ASSERT_TRUE(prev <= vec.front());
    }

    // assume is sorted
    bool sorted = mxx::is_sorted(vec.begin(), vec.end(), std::less<int>(), c);
    ASSERT_EQ(true, sorted);

}